

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<bsim::unsigned_int<3>const&>::
captureExpression<(Catch::Internal::Operator)0,bsim::unsigned_int<3>>
          (ExpressionLhs<bsim::unsigned_int<3>const&> *this,unsigned_int<3> *rhs)

{
  ResultBuilder *pRVar1;
  bool bVar2;
  OfType OVar3;
  unsigned_int<3> *_value;
  unsigned_int<3> *_value_00;
  allocator local_79;
  string local_78 [32];
  string local_58;
  string local_38;
  
  pRVar1 = *(ResultBuilder **)this;
  bVar2 = bsim::bit_vector<3>::equals(*(bit_vector<3> **)(this + 8),&rhs->bits);
  OVar3 = ExpressionFailed;
  if (bVar2) {
    OVar3 = Ok;
  }
  (pRVar1->m_data).resultType = OVar3;
  Detail::StringMakerBase<true>::convert<bsim::unsigned_int<3>>
            (&local_38,*(StringMakerBase<true> **)(this + 8),_value);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).lhs);
  Detail::StringMakerBase<true>::convert<bsim::unsigned_int<3>>
            (&local_58,(StringMakerBase<true> *)rhs,_value_00);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).rhs);
  std::__cxx11::string::string(local_78,"==",&local_79);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).op);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }